

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

_Bool rf_format_pixels_to_normalized
                (void *src,rf_int src_size,rf_uncompressed_pixel_format src_format,rf_vec4 *dst,
                rf_int dst_size)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  rf_source_location source_location;
  long lVar4;
  long lVar5;
  float *pfVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  long in_FS_OFFSET;
  float fVar10;
  
  uVar9 = src_format - RF_UNCOMPRESSED_GRAYSCALE;
  if (uVar9 < 10) {
    lVar8 = *(long *)(&DAT_0017bf58 + (ulong)uVar9 * 8);
  }
  else {
    lVar8 = 0;
  }
  lVar4 = src_size / lVar8;
  if ((long)((ulong)dst_size >> 4) < lVar4) {
    source_location.proc_name._0_4_ = 0x17c7a9;
    source_location.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    source_location.proc_name._4_4_ = 0;
    source_location.line_in_file = 0x32d;
    rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                "Buffer is size %d but function expected a size of at least %d.",4,dst_size,
                lVar4 << 4,src_size,
                "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                ,"rf_format_pixels_to_normalized",0x32d);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_format_pixels_to_normalized";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x32d;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 4;
  }
  else {
    switch(uVar9) {
    case 0:
      if (0 < dst_size && 0 < src_size) {
        pfVar6 = &dst->w;
        lVar5 = 0;
        lVar7 = 1;
        do {
          fVar10 = (float)*(byte *)((long)src + lVar5) / 255.0;
          ((rf_vec4 *)(pfVar6 + -3))->x = fVar10;
          pfVar6[-2] = fVar10;
          pfVar6[-1] = fVar10;
          *pfVar6 = 1.0;
          lVar5 = lVar5 + lVar8;
          if (src_size <= lVar5) break;
          pfVar6 = pfVar6 + 4;
          bVar3 = lVar7 < dst_size;
          lVar7 = lVar7 + 1;
        } while (bVar3);
      }
      break;
    case 1:
      if (0 < dst_size && 0 < src_size) {
        pfVar6 = &dst->w;
        lVar5 = 0;
        lVar7 = 1;
        do {
          bVar1 = *(byte *)((long)src + lVar5 + 1);
          fVar10 = (float)*(byte *)((long)src + lVar5) / 255.0;
          ((rf_vec4 *)(pfVar6 + -3))->x = fVar10;
          pfVar6[-2] = fVar10;
          pfVar6[-1] = fVar10;
          *pfVar6 = (float)bVar1 / 255.0;
          lVar5 = lVar5 + lVar8;
          if (src_size <= lVar5) break;
          pfVar6 = pfVar6 + 4;
          bVar3 = lVar7 < dst_size;
          lVar7 = lVar7 + 1;
        } while (bVar3);
      }
      break;
    case 2:
      if (0 < dst_size && 0 < src_size) {
        pfVar6 = &dst->w;
        lVar5 = 0;
        lVar7 = 1;
        do {
          uVar2 = *(ushort *)((long)src + lVar5 * 2);
          ((rf_vec4 *)(pfVar6 + -3))->x = (float)(uVar2 >> 0xb) * 0.032258064;
          pfVar6[-2] = (float)(uVar2 >> 5 & 0x3f) * 0.015873017;
          pfVar6[-1] = (float)(uVar2 & 0x1f) * 0.032258064;
          *pfVar6 = 1.0;
          lVar5 = lVar5 + lVar8;
          if (src_size <= lVar5) break;
          pfVar6 = pfVar6 + 4;
          bVar3 = lVar7 < dst_size;
          lVar7 = lVar7 + 1;
        } while (bVar3);
      }
      break;
    case 3:
      if (0 < dst_size && 0 < src_size) {
        pfVar6 = &dst->w;
        lVar5 = 0;
        lVar7 = 1;
        do {
          ((rf_vec4 *)(pfVar6 + -3))->x = (float)*(byte *)((long)src + lVar5) / 255.0;
          pfVar6[-2] = (float)*(byte *)((long)src + lVar5 + 1) / 255.0;
          pfVar6[-1] = (float)*(byte *)((long)src + lVar5 + 2) / 255.0;
          *pfVar6 = 1.0;
          lVar5 = lVar5 + lVar8;
          if (src_size <= lVar5) break;
          pfVar6 = pfVar6 + 4;
          bVar3 = lVar7 < dst_size;
          lVar7 = lVar7 + 1;
        } while (bVar3);
      }
      break;
    case 4:
      if (0 < dst_size && 0 < src_size) {
        pfVar6 = &dst->w;
        lVar5 = 0;
        lVar7 = 1;
        do {
          uVar2 = *(ushort *)((long)src + lVar5 * 2);
          ((rf_vec4 *)(pfVar6 + -3))->x = (float)(uVar2 >> 0xb) * 0.032258064;
          pfVar6[-2] = (float)(uVar2 >> 6 & 0x1f) * 0.032258064;
          pfVar6[-1] = (float)(uVar2 >> 1 & 0x1f) * 0.032258064;
          fVar10 = 0.0;
          if ((uVar2 & 1) != 0) {
            fVar10 = 1.0;
          }
          *pfVar6 = fVar10;
          lVar5 = lVar5 + lVar8;
          if (src_size <= lVar5) break;
          pfVar6 = pfVar6 + 4;
          bVar3 = lVar7 < dst_size;
          lVar7 = lVar7 + 1;
        } while (bVar3);
      }
      break;
    case 5:
      if (0 < dst_size && 0 < src_size) {
        pfVar6 = &dst->w;
        lVar5 = 0;
        lVar7 = 1;
        do {
          uVar2 = *(ushort *)((long)src + lVar5 * 2);
          ((rf_vec4 *)(pfVar6 + -3))->x = (float)(uVar2 >> 0xc) * 0.06666667;
          pfVar6[-2] = (float)(uVar2 >> 8 & 0xf) * 0.06666667;
          pfVar6[-1] = (float)(uVar2 >> 4 & 0xf) * 0.06666667;
          *pfVar6 = (float)(uVar2 & 0xf) * 0.06666667;
          lVar5 = lVar5 + lVar8;
          if (src_size <= lVar5) break;
          pfVar6 = pfVar6 + 4;
          bVar3 = lVar7 < dst_size;
          lVar7 = lVar7 + 1;
        } while (bVar3);
      }
      break;
    case 6:
      if (0 < dst_size && 0 < src_size) {
        pfVar6 = &dst->w;
        lVar5 = 0;
        lVar7 = 1;
        do {
          ((rf_vec4 *)(pfVar6 + -3))->x = (float)*(byte *)((long)src + lVar5) / 255.0;
          pfVar6[-2] = (float)*(byte *)((long)src + lVar5 + 1) / 255.0;
          pfVar6[-1] = (float)*(byte *)((long)src + lVar5 + 2) / 255.0;
          *pfVar6 = (float)*(byte *)((long)src + lVar5 + 3) / 255.0;
          lVar5 = lVar5 + lVar8;
          if (src_size <= lVar5) break;
          pfVar6 = pfVar6 + 4;
          bVar3 = lVar7 < dst_size;
          lVar7 = lVar7 + 1;
        } while (bVar3);
      }
      break;
    case 7:
      if (0 < dst_size && 0 < src_size) {
        pfVar6 = &dst->w;
        lVar5 = 0;
        lVar7 = 1;
        do {
          ((rf_vec4 *)(pfVar6 + -3))->x = *(float *)((long)src + lVar5 * 4);
          *(undefined8 *)(pfVar6 + -2) = 0;
          *pfVar6 = 1.0;
          lVar5 = lVar5 + lVar8;
          if (src_size <= lVar5) break;
          pfVar6 = pfVar6 + 4;
          bVar3 = lVar7 < dst_size;
          lVar7 = lVar7 + 1;
        } while (bVar3);
      }
      break;
    case 8:
      if (0 < dst_size && 0 < src_size) {
        pfVar6 = &dst->w;
        lVar5 = 0;
        lVar7 = 1;
        do {
          ((rf_vec4 *)(pfVar6 + -3))->x = *(float *)((long)src + lVar5 * 4);
          pfVar6[-2] = *(float *)((long)src + lVar5 * 4 + 4);
          pfVar6[-1] = *(float *)((long)src + lVar5 * 4 + 8);
          *pfVar6 = 1.0;
          lVar5 = lVar5 + lVar8;
          if (src_size <= lVar5) break;
          pfVar6 = pfVar6 + 4;
          bVar3 = lVar7 < dst_size;
          lVar7 = lVar7 + 1;
        } while (bVar3);
      }
      break;
    case 9:
      memcpy(dst,src,src_size);
    }
  }
  return lVar4 <= (long)((ulong)dst_size >> 4);
}

Assistant:

RF_API bool rf_format_pixels_to_normalized(const void* src, rf_int src_size, rf_uncompressed_pixel_format src_format, rf_vec4* dst, rf_int dst_size)
{
    bool success = false;

    rf_int src_bpp = rf_bytes_per_pixel(src_format);
    rf_int src_pixel_count = src_size / src_bpp;
    rf_int dst_pixel_count = dst_size / sizeof(rf_vec4);

    if (dst_pixel_count >= src_pixel_count)
    {
        if (src_format == RF_UNCOMPRESSED_R32G32B32A32)
        {
            success = true;
            memcpy(dst, src, src_size);
        }
        else
        {
            success = true;

            #define RF_FOR_EACH_PIXEL for (rf_int dst_iter = 0, src_iter = 0; src_iter < src_size && dst_iter < dst_size; dst_iter++, src_iter += src_bpp)
            switch (src_format)
            {
                case RF_UNCOMPRESSED_GRAYSCALE:
                    RF_FOR_EACH_PIXEL
                    {
                        float value = ((unsigned char*)src)[src_iter] / 255.0f;

                        dst[dst_iter].x = value;
                        dst[dst_iter].y = value;
                        dst[dst_iter].z = value;
                        dst[dst_iter].w = 1.0f;
                    }
                    break;

                case RF_UNCOMPRESSED_GRAY_ALPHA:
                    RF_FOR_EACH_PIXEL
                    {
                        float value0 = (float)((unsigned char*)src)[src_iter + 0] / 255.0f;
                        float value1 = (float)((unsigned char*)src)[src_iter + 1] / 255.0f;

                        dst[dst_iter].x = value0;
                        dst[dst_iter].y = value0;
                        dst[dst_iter].z = value0;
                        dst[dst_iter].w = value1;
                    }
                    break;

                case RF_UNCOMPRESSED_R5G5B5A1:
                    RF_FOR_EACH_PIXEL
                    {
                        unsigned short pixel = ((unsigned short*) src)[src_iter];

                        dst[dst_iter].x = (float)((pixel & 0b1111100000000000) >> 11) * (1.0f/31);
                        dst[dst_iter].y = (float)((pixel & 0b0000011111000000) >>  6) * (1.0f/31);
                        dst[dst_iter].z = (float)((pixel & 0b0000000000111110) >>  1) * (1.0f/31);
                        dst[dst_iter].w = ((pixel & 0b0000000000000001) == 0) ? 0.0f : 1.0f;
                    }
                    break;

                case RF_UNCOMPRESSED_R5G6B5:
                    RF_FOR_EACH_PIXEL
                    {
                        unsigned short pixel = ((unsigned short*)src)[src_iter];

                        dst[dst_iter].x = (float)((pixel & 0b1111100000000000) >> 11) * (1.0f / 31);
                        dst[dst_iter].y = (float)((pixel & 0b0000011111100000) >>  5) * (1.0f / 63);
                        dst[dst_iter].z = (float) (pixel & 0b0000000000011111)        * (1.0f / 31);
                        dst[dst_iter].w = 1.0f;
                    }
                    break;

                case RF_UNCOMPRESSED_R4G4B4A4:
                    RF_FOR_EACH_PIXEL
                    {
                        unsigned short pixel = ((unsigned short*)src)[src_iter];

                        dst[dst_iter].x = (float)((pixel & 0b1111000000000000) >> 12) * (1.0f / 15);
                        dst[dst_iter].y = (float)((pixel & 0b0000111100000000) >> 8)  * (1.0f / 15);
                        dst[dst_iter].z = (float)((pixel & 0b0000000011110000) >> 4)  * (1.0f / 15);
                        dst[dst_iter].w = (float) (pixel & 0b0000000000001111)        * (1.0f / 15);
                    }
                    break;

                case RF_UNCOMPRESSED_R8G8B8A8:
                    RF_FOR_EACH_PIXEL
                    {
                        dst[dst_iter].x = (float)((unsigned char*)src)[src_iter + 0] / 255.0f;
                        dst[dst_iter].y = (float)((unsigned char*)src)[src_iter + 1] / 255.0f;
                        dst[dst_iter].z = (float)((unsigned char*)src)[src_iter + 2] / 255.0f;
                        dst[dst_iter].w = (float)((unsigned char*)src)[src_iter + 3] / 255.0f;
                    }
                    break;

                case RF_UNCOMPRESSED_R8G8B8:
                    RF_FOR_EACH_PIXEL
                    {
                        dst[dst_iter].x = (float)((unsigned char*)src)[src_iter + 0] / 255.0f;
                        dst[dst_iter].y = (float)((unsigned char*)src)[src_iter + 1] / 255.0f;
                        dst[dst_iter].z = (float)((unsigned char*)src)[src_iter + 2] / 255.0f;
                        dst[dst_iter].w = 1.0f;
                    }
                    break;

                case RF_UNCOMPRESSED_R32:
                    RF_FOR_EACH_PIXEL
                    {
                        dst[dst_iter].x = ((float*)src)[src_iter];
                        dst[dst_iter].y = 0.0f;
                        dst[dst_iter].z = 0.0f;
                        dst[dst_iter].w = 1.0f;
                    }
                    break;

                case RF_UNCOMPRESSED_R32G32B32:
                    RF_FOR_EACH_PIXEL
                    {
                        dst[dst_iter].x = ((float*)src)[src_iter + 0];
                        dst[dst_iter].y = ((float*)src)[src_iter + 1];
                        dst[dst_iter].z = ((float*)src)[src_iter + 2];
                        dst[dst_iter].w = 1.0f;
                    }
                    break;

                case RF_UNCOMPRESSED_R32G32B32A32:
                    RF_FOR_EACH_PIXEL
                    {
                        dst[dst_iter].x = ((float*)src)[src_iter + 0];
                        dst[dst_iter].y = ((float*)src)[src_iter + 1];
                        dst[dst_iter].z = ((float*)src)[src_iter + 2];
                        dst[dst_iter].w = ((float*)src)[src_iter + 3];
                    }
                    break;

                default: break;
            }